

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O2

void my_canvas_save(t_gobj *z,_binbuf *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  t_symbol *ptVar12;
  t_symbol *ptVar13;
  t_symbol *ptVar14;
  t_symbol *srl [3];
  t_symbol *bflcol [3];
  undefined4 local_68 [2];
  undefined4 uStack_60;
  undefined8 local_58;
  t_symbol *local_48 [2];
  undefined8 local_38;
  
  iemgui_save((t_iemgui *)z,(t_symbol **)local_68,local_48);
  ptVar12 = gensym("#X");
  ptVar13 = gensym("obj");
  sVar1 = *(short *)&z[2].g_next;
  sVar2 = *(short *)((long)&z[2].g_next + 2);
  ptVar14 = gensym("cnv");
  iVar3 = *(int *)((long)&z[4].g_pd + 4);
  iVar4 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  uVar5 = *(undefined4 *)&z[0x4c].g_pd;
  uVar6 = *(undefined4 *)((long)&z[0x4c].g_pd + 4);
  uVar7 = *(undefined4 *)&z[5].g_pd;
  uVar8 = *(undefined4 *)((long)&z[5].g_pd + 4);
  iVar10 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  uVar9 = *(undefined4 *)((long)&z[0x44].g_pd + 4);
  iVar11 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  binbuf_addv(b,"ssiisiiisssiiiissi",ptVar12,ptVar13,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar2
              ,ptVar14,iVar3 / iVar4,uVar5,uVar6,local_68[0],uStack_60,local_58,uVar7,uVar8,iVar10,
              uVar9,local_48[0],local_38,iVar11);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void my_canvas_save(t_gobj *z, t_binbuf *b)
{
    t_my_canvas *x = (t_my_canvas *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    iemgui_save(&x->x_gui, srl, bflcol);
    binbuf_addv(b, "ssiisiiisssiiiissi", gensym("#X"),gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix, (int)x->x_gui.x_obj.te_ypix,
                gensym("cnv"), x->x_gui.x_w/IEMGUI_ZOOM(x), x->x_vis_w, x->x_vis_h,
                srl[0], srl[1], srl[2], x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[2], iem_symargstoint(&x->x_gui.x_isa));
    binbuf_addv(b, ";");
}